

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfLineOrderAttribute.cpp
# Opt level: O1

void __thiscall
Imf_2_5::TypedAttribute<Imf_2_5::LineOrder>::readValueFrom
          (TypedAttribute<Imf_2_5::LineOrder> *this,IStream *is,int size,int version)

{
  undefined8 in_RAX;
  uchar tmp;
  byte local_11;
  
  local_11 = (byte)((ulong)in_RAX >> 0x38);
  (*is->_vptr_IStream[3])(is,&local_11,1);
  if (2 < local_11) {
    local_11 = 3;
  }
  this->_value = (uint)local_11;
  return;
}

Assistant:

void
LineOrderAttribute::readValueFrom (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream &is, int size, int version)
{
    unsigned char tmp;
    Xdr::read <StreamIO> (is, tmp);

    //
    // prevent invalid values being written to LineOrder enum
    // by forcing all unknown types to NUM_LINEORDERS which is also an invalid
    // value but is a legal enum. Note that Header::sanityCheck will
    // throw an exception when files with invalid lineOrders 
    //
    
    if (tmp != INCREASING_Y &&
        tmp != DECREASING_Y &&
        tmp != RANDOM_Y)
        tmp = NUM_LINEORDERS;

    _value = LineOrder (tmp);
}